

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true> * __thiscall
duckdb::Binder::FindCTE
          (vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true>
           *__return_storage_ptr__,Binder *this,string *name,bool skip)

{
  __type skip_00;
  iterator iVar1;
  pointer pSVar2;
  pointer pQVar3;
  Binder *this_00;
  vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true> parent_ctes;
  _Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  local_40;
  
  iVar1 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->CTE_bindings)._M_h,name);
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    if (skip) {
      pSVar2 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
               ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                             *)(*(long *)((long)iVar1.
                                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_true>
                                                ._M_cur + 0x28) + 0x30));
      pQVar3 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
               operator->(&pSVar2->node);
      if (pQVar3->type != RECURSIVE_CTE_NODE) goto LAB_006281d8;
    }
    ::std::
    vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
    ::push_back(&__return_storage_ptr__->
                 super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
                ,(value_type *)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_true>
                        ._M_cur + 0x28));
  }
LAB_006281d8:
  if (((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0) && (this->binder_type == REGULAR_BINDER)) {
    this_00 = shared_ptr<duckdb::Binder,_true>::operator->(&this->parent);
    skip_00 = ::std::operator==(name,&this->alias);
    FindCTE((vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true> *)&local_40,
            this_00,name,skip_00);
    ::std::
    vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>*,std::vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>>>>,void>
              ((vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_*,_std::vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>_>
                )local_40._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_*,_std::vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>_>
                )local_40._M_impl.super__Vector_impl_data._M_finish);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
    ::~_Vector_base(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<reference<CommonTableExpressionInfo>> Binder::FindCTE(const string &name, bool skip) {
	auto entry = CTE_bindings.find(name);
	vector<reference<CommonTableExpressionInfo>> ctes;
	if (entry != CTE_bindings.end()) {
		if (!skip || entry->second.get().query->node->type == QueryNodeType::RECURSIVE_CTE_NODE) {
			ctes.push_back(entry->second);
		}
	}
	if (parent && binder_type == BinderType::REGULAR_BINDER) {
		auto parent_ctes = parent->FindCTE(name, name == alias);
		ctes.insert(ctes.end(), parent_ctes.begin(), parent_ctes.end());
	}
	return ctes;
}